

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * update_additional_D_Sym(D_Scope *st,D_Sym *sym,int sizeof_D_Sym)

{
  D_Scope **ppDVar1;
  D_Sym *pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  D_Scope *pDVar7;
  D_Sym *pDVar8;
  D_Sym *pDVar9;
  D_Sym *pDVar10;
  
  pDVar10 = sym->update_of;
  if (sym->update_of == (D_Sym *)0x0) {
    pDVar10 = sym;
  }
  pDVar7 = st;
  pDVar9 = pDVar10;
  if (st != (D_Scope *)0x0) {
    do {
      for (pDVar9 = pDVar7->updates; pDVar9 != (D_Sym *)0x0; pDVar9 = pDVar9->next) {
        if (pDVar9->update_of == pDVar10) goto LAB_00147c12;
      }
      ppDVar1 = &pDVar7->up_updates;
      pDVar7 = *ppDVar1;
      pDVar9 = pDVar10;
    } while (*ppDVar1 != (D_Scope *)0x0);
  }
LAB_00147c12:
  pDVar8 = (D_Sym *)malloc((long)sizeof_D_Sym);
  iVar3 = pDVar9->len;
  uVar4 = pDVar9->hash;
  pDVar7 = pDVar9->scope;
  pDVar10 = pDVar9->update_of;
  pDVar2 = pDVar9->next;
  uVar5 = pDVar9->user;
  uVar6 = *(undefined4 *)&pDVar9->field_0x2c;
  pDVar8->name = pDVar9->name;
  pDVar8->len = iVar3;
  pDVar8->hash = uVar4;
  pDVar8->scope = pDVar7;
  pDVar8->update_of = pDVar10;
  pDVar8->next = pDVar2;
  pDVar8->user = uVar5;
  *(undefined4 *)&pDVar8->field_0x2c = uVar6;
  pDVar10 = pDVar9->update_of;
  if (pDVar9->update_of == (D_Sym *)0x0) {
    pDVar10 = pDVar9;
  }
  pDVar8->update_of = pDVar10;
  pDVar8->next = st->updates;
  st->updates = pDVar8;
  return pDVar8;
}

Assistant:

D_Sym *update_additional_D_Sym(D_Scope *st, D_Sym *sym, int sizeof_D_Sym) {
  D_Sym *s;

  sym = current_D_Sym(st, sym);
  s = MALLOC(sizeof_D_Sym);
  memcpy(s, sym, sizeof(D_Sym));
  if (sym->update_of) sym = sym->update_of;
  s->update_of = sym;
  s->next = st->updates;
  st->updates = s;
  return s;
}